

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O3

void __thiscall CoreML::ShapeRange::ShapeRange(ShapeRange *this,size_t min,size_t max)

{
  ostream *poVar1;
  runtime_error *this_00;
  stringstream ss;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  RangeValue::RangeValue(&this->_minimum,min);
  RangeValue::RangeValue(&this->_maximum,max);
  if (min <= max) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"Constructing invalid ShapeRange with ",0x25);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,asStack_1c8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ShapeRange::ShapeRange(size_t min, size_t max)
:
_minimum(min),
_maximum(max)
{
    if (min > max) {
        std::stringstream ss;
        ss << "Constructing invalid ShapeRange with " << min << ", " << max;
        throw std::runtime_error(ss.str());
    }
}